

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void __thiscall BMP::fun(BMP *this,HuffmanTree *node,string *code)

{
  if (node->left != (HuffmanTree *)0x0) {
    std::__cxx11::string::push_back((char)code);
    fun(this,node->left,code);
  }
  if (node->right != (HuffmanTree *)0x0) {
    std::__cxx11::string::push_back((char)code);
    fun(this,node->right,code);
  }
  if ((long)node->posAlb != -1) {
    std::__cxx11::string::_M_assign((string *)&this->alphabet->symbol[node->posAlb].codeHuffman);
  }
  if (code->_M_string_length != 0) {
    std::__cxx11::string::pop_back();
    return;
  }
  return;
}

Assistant:

void BMP::fun( bitMap::HuffmanTree *node, std::string &code)
{
    if ( node->left != nullptr ){
        code += '0';
        fun( node->left, code );
    }

    if ( node->right != nullptr ){
        code += '1';
        fun( node->right, code );
    }

    if ( node->posAlb != -1 ) {
        alphabet->symbol[ node->posAlb ].codeHuffman = code;
    }


	if ( !code.empty() ) {
        code.pop_back();
    }
}